

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O3

ProcessStatus __thiscall
llbuild::basic::ExecutionQueue::executeProcess
          (ExecutionQueue *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine)

{
  ProcessStatus PVar1;
  future<llbuild::basic::ProcessStatus> result;
  promise<llbuild::basic::ProcessStatus> p;
  undefined4 local_a0;
  undefined4 uStack_88;
  __basic_future<llbuild::basic::ProcessStatus> local_80;
  promise<llbuild::basic::ProcessStatus> *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  char local_50;
  promise<llbuild::basic::ProcessStatus> local_48;
  
  std::promise<llbuild::basic::ProcessStatus>::promise(&local_48);
  std::__basic_future<llbuild::basic::ProcessStatus>::__basic_future(&local_80,&local_48._M_future);
  local_a0 = CONCAT22(local_a0._2_2_,1);
  uStack_88 = CONCAT22(uStack_88._2_2_,0x101);
  local_50 = '\x01';
  local_58 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/ExecutionQueue.cpp:45:19)>
             ::_M_invoke;
  local_68 = 0;
  local_60 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/ExecutionQueue.cpp:45:19)>
             ::_M_manager;
  local_70 = &local_48;
  (*this->_vptr_ExecutionQueue[4])
            (this,context,commandLine.Data,commandLine.Length,0,0,local_a0,0,0,uStack_88,&local_70,0
            );
  if (local_50 == '\x01') {
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,3);
    }
    local_50 = '\0';
  }
  PVar1 = std::future<llbuild::basic::ProcessStatus>::get
                    ((future<llbuild::basic::ProcessStatus> *)&local_80);
  if (local_80._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<llbuild::basic::ProcessStatus>::~promise(&local_48);
  return PVar1;
}

Assistant:

ProcessStatus ExecutionQueue::executeProcess(QueueJobContext* context,
                                             ArrayRef<StringRef> commandLine) {
  std::promise<ProcessStatus> p;
  auto result = p.get_future();
  executeProcess(context, commandLine, {}, {true},
                 {[&p](ProcessResult result) mutable {
    p.set_value(result.status);
  }});
  return result.get();
}